

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O2

void __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::AddObj
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,Type type,NumericExpr expr,
          int num_linear_terms)

{
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"objective",&local_31);
  TestProblemBuilder::ReportUnhandledConstruct((TestProblemBuilder *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

LinearObjBuilder AddObj(
      obj::Type type, NumericExpr expr, int num_linear_terms) {
    internal::Unused(type, &expr, num_linear_terms);
    MP_DISPATCH(ReportUnhandledConstruct("objective"));
    return LinearObjBuilder();
  }